

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

Vec4 __thiscall glcts::BlendDarken(glcts *this,Vec4 *src,Vec4 *dst)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vec4 VVar7;
  Vec4 local_18;
  
  uVar1 = -(uint)(src->m_data[2] <= dst->m_data[2]);
  local_18.m_data[2] = (float)(~uVar1 & (uint)dst->m_data[2] | (uint)src->m_data[2] & uVar1);
  fVar3 = (float)*(undefined8 *)src->m_data;
  fVar4 = (float)((ulong)*(undefined8 *)src->m_data >> 0x20);
  fVar5 = (float)*(undefined8 *)dst->m_data;
  fVar6 = (float)((ulong)*(undefined8 *)dst->m_data >> 0x20);
  uVar1 = -(uint)(fVar3 <= fVar5);
  uVar2 = -(uint)(fVar4 <= fVar6);
  local_18.m_data._0_8_ =
       CONCAT44(~uVar2 & (uint)fVar6,~uVar1 & (uint)fVar5) |
       CONCAT44((uint)fVar4 & uVar2,(uint)fVar3 & uVar1);
  local_18.m_data[3] = 0.0;
  VVar7 = Blend(this,&local_18,src,dst);
  return (Vec4)VVar7.m_data;
}

Assistant:

static tcu::Vec4 BlendDarken(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(de::min(src[0], dst[0]), de::min(src[1], dst[1]), de::min(src[2], dst[2]), 0.f);

	return Blend(rgb, src, dst);
}